

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mat.cpp
# Opt level: O2

void __thiscall Mat::reoeder(Mat *this)

{
  undefined8 *puVar1;
  uint uVar2;
  undefined8 uVar3;
  uint uVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  undefined8 *puVar10;
  long lVar11;
  vector<__int128,_std::allocator<__int128>_> v;
  allocator_type local_31;
  _Vector_base<__int128,_std::allocator<__int128>_> local_30;
  
  std::vector<__int128,_std::allocator<__int128>_>::vector
            ((vector<__int128,_std::allocator<__int128>_> *)&local_30,(long)this->c * (long)this->r,
             &local_31);
  uVar2 = this->c;
  uVar4 = this->r;
  if (this->order == 1) {
    uVar2 = this->r;
    uVar4 = this->c;
  }
  lVar5 = 0;
  uVar6 = 0;
  if (0 < (int)uVar2) {
    uVar6 = (ulong)uVar2;
  }
  uVar7 = 0;
  if (0 < (int)uVar4) {
    uVar7 = (ulong)uVar4;
  }
  lVar8 = 0;
  for (uVar9 = 0; uVar9 != uVar7; uVar9 = uVar9 + 1) {
    puVar10 = (undefined8 *)
              ((long)(this->val).super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl.
                     super__Vector_impl_data._M_start + lVar5);
    for (lVar11 = 0; uVar6 * 0x10 != lVar11; lVar11 = lVar11 + 0x10) {
      uVar3 = puVar10[1];
      puVar1 = (undefined8 *)
               ((long)local_30._M_impl.super__Vector_impl_data._M_start + lVar11 + lVar8);
      *puVar1 = *puVar10;
      puVar1[1] = uVar3;
      puVar10 = puVar10 + (long)(int)uVar4 * 2;
    }
    lVar8 = lVar8 + (long)(int)uVar2 * 0x10;
    lVar5 = lVar5 + 0x10;
  }
  std::vector<__int128,std::allocator<__int128>>::
  _M_assign_aux<__gnu_cxx::__normal_iterator<__int128*,std::vector<__int128,std::allocator<__int128>>>>
            ((vector<__int128,std::allocator<__int128>> *)&this->val,
             local_30._M_impl.super__Vector_impl_data._M_start,
             local_30._M_impl.super__Vector_impl_data._M_finish);
  *(byte *)&this->order = (byte)this->order ^ 1;
  std::_Vector_base<__int128,_std::allocator<__int128>_>::~_Vector_base(&local_30);
  return;
}

Assistant:

void Mat::reoeder() {
    vector<ll128> v(r * c);
    int tmp_r = r;
    int tmp_c = c;
    if (order == MatRowMajor) {
        swap(tmp_r, tmp_c);
    }
    for (int i = 0; i < tmp_r; i++) {
        for (int j = 0; j < tmp_c; j++) {
            v[i * tmp_c + j] = val[j * tmp_r + i];
        }
    }
    val.assign(v.begin(), v.end());
    order ^= 1;
}